

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test7::configureXFBBuffer(GPUShaderFP64Test7 *this,_variables *variables)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  deUint32 err;
  reference p_Var4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  Functions *gl;
  uint n_bytes_needed;
  _variable *variable;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
  local_28;
  _variables_const_iterator variables_iterator;
  uint bo_size;
  _variables *variables_local;
  GPUShaderFP64Test7 *this_local;
  
  variables_iterator._M_current._4_4_ = 0;
  local_28._M_current =
       (_variable *)
       std::
       vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
       ::begin(variables);
  while( true ) {
    variable = (_variable *)
               std::
               vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               ::end(variables);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
                        *)&variable);
    if (!bVar1) break;
    p_Var4 = __gnu_cxx::
             __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
             ::operator*(&local_28);
    uVar2 = Utils::getNumberOfComponentsForVariableType(p_Var4->type);
    variables_iterator._M_current._4_4_ =
         uVar2 * p_Var4->array_size * 8 + variables_iterator._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test7::_variable_*,_std::vector<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>_>
    ::operator++(&local_28,0);
  }
  variables_iterator._M_current._4_4_ = variables_iterator._M_current._4_4_ * 6;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x150))
            (0x8c8e,variables_iterator._M_current._4_4_,0,0x88e4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2362);
  return;
}

Assistant:

void GPUShaderFP64Test7::configureXFBBuffer(const _variables& variables)
{
	DE_ASSERT(m_n_xfb_varyings != 0);

	/* Geometry shaders outputs 4 vertices making up a triangle strip per draw call.
	 * The test only draws a single patch, and triangles are caught by transform feed-back.
	 * Let's initialize the storage, according to the list of variables that will be used
	 * for the test run.
	 */
	unsigned int bo_size = 0;

	for (_variables_const_iterator variables_iterator = variables.begin(); variables_iterator != variables.end();
		 variables_iterator++)
	{
		const _variable& variable		= *variables_iterator;
		unsigned int	 n_bytes_needed = static_cast<unsigned int>(
			Utils::getNumberOfComponentsForVariableType(variable.type) * variable.array_size * sizeof(double));

		bo_size += n_bytes_needed;
	} /* for (all variables) */

	bo_size *= 3 /* vertices per triangle */ * 2; /* triangles emitted by geometry shader */

	/* Set up the BO storage */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");
}